

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8Utils.c
# Opt level: O0

int XFastConvertUtf8ToUcs(uchar *buf,int len,uint *ucs)

{
  uint *ucs_local;
  int len_local;
  uchar *buf_local;
  
  if ((*buf & 0x80) == 0) {
    if (0 < len) {
      *ucs = (uint)*buf;
      return 1;
    }
  }
  else if ((*buf & 0x40) != 0) {
    if ((*buf & 0x20) == 0) {
      if (1 < len) {
        *ucs = (*buf & 0xffffff3f) * 0x40 + (buf[1] & 0xffffff7f);
        return 2;
      }
    }
    else if ((*buf & 0x10) == 0) {
      if (2 < len) {
        *ucs = (*buf & 0xffffff1f) * 0x1000 + (buf[1] & 0xffffff7f) * 0x40 + (buf[2] & 0xffffff7f);
        return 3;
      }
    }
    else if ((*buf & 8) == 0) {
      if (3 < len) {
        *ucs = (*buf & 0xffffff0f) * 0x40000 + (buf[1] & 0xffffff7f) * 0x1000 +
               (buf[2] & 0xffffff7f) * 0x40 + (buf[3] & 0xffffff7f);
        return 4;
      }
    }
    else if (((*buf & 4) == 0) && (4 < len)) {
      *ucs = (*buf & 0xffffff07) * 0x1000000 + (buf[1] & 0xffffff7f) * 0x40000 +
             (buf[2] & 0xffffff7f) * 0x1000 + (buf[3] & 0xffffff7f) * 0x40 + (buf[4] & 0xffffff7f);
      return 5;
    }
  }
  *ucs = 0x3f;
  return -1;
}

Assistant:

int
XFastConvertUtf8ToUcs(const unsigned char     *buf,
		      int                     len,
		      unsigned int            *ucs) {

  if (buf[0] & 0x80) {
    if (buf[0] & 0x40) {
      if (buf[0] & 0x20) {
	if (buf[0] & 0x10) {
	  if (buf[0] & 0x08) {
	    if (buf[0] & 0x04) {
	      if (buf[0] & 0x02) {
		/* bad UTF-8 string */
	      } else {
		/* 0x04000000 - 0x7FFFFFFF */
	      }	
	    } else if (len > 4) {
	      /* 0x00200000 - 0x03FFFFFF */
	      *ucs =  ((buf[0] & ~0xF8) << 24) +
		      ((buf[1] & ~0x80) << 18) +
		      ((buf[2] & ~0x80) << 12) +
		      ((buf[3] & ~0x80) << 6) +
		       (buf[4] & ~0x80);
	      return 5;
	    }
	  } else if (len > 3) {
	    /* 0x00010000 - 0x001FFFFF */
	    *ucs =  ((buf[0] & ~0xF0) << 18) +
		    ((buf[1] & ~0x80) << 12) +
		    ((buf[2] & ~0x80) << 6) +
		     (buf[3] & ~0x80);
	    return 4;
	  }
	} else if (len > 2) {
	  /* 0x00000800 - 0x0000FFFF */
	  *ucs =  ((buf[0] & ~0xE0) << 12) +
		  ((buf[1] & ~0x80) << 6) +
		   (buf[2] & ~0x80);
	  return 3;
	}	
      } else if (len > 1) {
	/* 0x00000080 - 0x000007FF */
	*ucs = ((buf[0] & ~0xC0) << 6) +
		(buf[1] & ~0x80);
	return 2;
      }
    }
  } else if (len > 0) {
    /* 0x00000000 - 0x0000007F */
    *ucs = buf[0];
    return 1;
  } 

  *ucs = (unsigned int) '?'; /* bad utf-8 string */
  return -1;
}